

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PFloat::SetValue(PFloat *this,void *addr,double val)

{
  int iVar1;
  
  if (((this->super_PBasicType).super_PType.Align - 1 & (uint)addr) != 0) {
    __assert_fail("((intptr_t)addr & (Align - 1)) == 0 && \"unaligned address\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                  ,0x54f,"virtual void PFloat::SetValue(void *, double)");
  }
  iVar1 = *(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24;
  if (iVar1 == 8) {
    *(double *)addr = val;
  }
  else {
    if (iVar1 != 4) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x556,"virtual void PFloat::SetValue(void *, double)");
    }
    *(float *)addr = (float)val;
  }
  return;
}

Assistant:

void PFloat::SetValue(void *addr, double val)
{
	assert(((intptr_t)addr & (Align - 1)) == 0 && "unaligned address");
	if (Size == 4)
	{
		*(float *)addr = (float)val;
	}
	else
	{
		assert(Size == 8);
		*(double *)addr = val;
	}
}